

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O3

void __thiscall
Outputs::Display::BufferingScanTarget::set_modals(BufferingScanTarget *this,Modals modals)

{
  __atomic_flag_data_type _Var1;
  long lVar2;
  Modals *pMVar3;
  undefined8 *puVar4;
  byte bVar5;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  bVar5 = 0;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = operator_new(0x50);
  *(BufferingScanTarget **)local_28._M_unused._0_8_ = this;
  pMVar3 = &modals;
  puVar4 = (undefined8 *)((long)local_28._M_unused._0_8_ + 8);
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pMVar3;
    pMVar3 = (Modals *)((long)pMVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  *(float *)((long)local_28._M_unused._0_8_ + 0x48) = modals.aspect_ratio;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp:303:10)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp:303:10)>
             ::_M_manager;
  do {
    LOCK();
    _Var1 = (this->is_updating_).super___atomic_flag_base._M_i;
    (this->is_updating_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp:303:10)>
  ::_M_invoke(&local_28);
  (this->is_updating_).super___atomic_flag_base._M_i = false;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void BufferingScanTarget::set_modals(Modals modals) {
	perform([=] {
		modals_ = modals;
		modals_are_dirty_.store(true, std::memory_order::memory_order_relaxed);
	});
}